

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O1

void __thiscall
TTD::TextFormatWriter::WriteInlinePropertyRecordName
          (TextFormatWriter *this,char16 *pname,uint32 length,Separator separator)

{
  undefined3 in_register_00000009;
  char16_t local_2c [2];
  
  (*(this->super_FileWriter)._vptr_FileWriter[2])
            (this,(ulong)CONCAT31(in_register_00000009,separator));
  FileWriter::WriteFormattedCharData<7ul,unsigned_int>
            (&this->super_FileWriter,(char16 (*) [7])L"@%I32u",length);
  local_2c[1] = 0x22;
  FileWriter::WriteRawByteBuff_Fixed<char16_t>(&this->super_FileWriter,local_2c + 1);
  FileWriter::WriteRawByteBuff(&this->super_FileWriter,(byte *)pname,(ulong)length * 2);
  local_2c[0] = L'\"';
  FileWriter::WriteRawByteBuff_Fixed<char16_t>(&this->super_FileWriter,local_2c);
  return;
}

Assistant:

void TextFormatWriter::WriteInlinePropertyRecordName(_In_reads_(length) const char16* pname, uint32 length, NSTokens::Separator separator)
    {
        this->WriteSeparator(separator);

        this->WriteFormattedCharData(_u("@%I32u"), length);

        this->WriteRawChar(_u('\"'));
        this->WriteRawCharBuff(pname, length);
        this->WriteRawChar(_u('\"'));
    }